

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<long>::Generators<Catch::Generators::GeneratorWrapper<long>,long>
          (Generators<long> *this,GeneratorWrapper<long> *moreGenerators,long *moreGenerators_1)

{
  long *moreGenerators_local_1;
  GeneratorWrapper<long> *moreGenerators_local;
  Generators<long> *this_local;
  
  IGenerator<long>::IGenerator(&this->super_IGenerator<long>);
  (this->super_IGenerator<long>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_007be0c8;
  std::
  vector<Catch::Generators::GeneratorWrapper<long>,_std::allocator<Catch::Generators::GeneratorWrapper<long>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<long>,_std::allocator<Catch::Generators::GeneratorWrapper<long>_>_>
  ::reserve(&this->m_generators,2);
  add_generators<Catch::Generators::GeneratorWrapper<long>,long>
            (this,moreGenerators,moreGenerators_1);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }